

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_ObjUpdatePriority(Acb_Ntk_t *p,int iObj)

{
  size_t sVar1;
  uint uVar2;
  float *pfVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((byte)((p->vObjType).pArray[(uint)iObj] - 5U) < 0xfe) {
    if ((p->vLevelD).nSize <= iObj) {
LAB_003ac8b3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vLevelD).pArray[(uint)iObj] == 1) {
      return;
    }
    pVVar4 = p->vQue;
    if (pVVar4 == (Vec_Que_t *)0x0) {
      uVar9 = (p->vObjType).nCap;
      if ((p->vCounts).nCap < (int)uVar9) {
        pfVar3 = (p->vCounts).pArray;
        if (pfVar3 == (float *)0x0) {
          pfVar3 = (float *)malloc((long)(int)uVar9 << 2);
        }
        else {
          pfVar3 = (float *)realloc(pfVar3,(long)(int)uVar9 << 2);
        }
        (p->vCounts).pArray = pfVar3;
        (p->vCounts).nCap = uVar9;
      }
      if (0 < (int)uVar9) {
        memset((p->vCounts).pArray,0,(ulong)uVar9 * 4);
      }
      (p->vCounts).nSize = uVar9;
      pVVar4 = (Vec_Que_t *)calloc(1,0x20);
      pVVar4->nCap = 0x3e9;
      pVVar4->nSize = 1;
      piVar5 = (int *)malloc(0xfa4);
      memset(piVar5,0xff,0xfa4);
      pVVar4->pHeap = piVar5;
      piVar5 = (int *)malloc(0xfa4);
      memset(piVar5,0xff,0xfa4);
      pVVar4->pOrder = piVar5;
      p->vQue = pVVar4;
      pVVar4->pCostsFlt = &(p->vCounts).pArray;
    }
    if (((p->vPathD).nSize <= iObj) || ((p->vPathR).nSize <= iObj)) goto LAB_003ac8b3;
    if ((p->vCounts).nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                    ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
    }
    iVar8 = (p->vPathR).pArray[(uint)iObj] * (p->vPathD).pArray[(uint)iObj];
    (p->vCounts).pArray[(uint)iObj] = (float)iVar8;
    uVar9 = pVVar4->nCap;
    if (iObj < (int)uVar9) {
      piVar5 = pVVar4->pOrder;
      uVar16 = piVar5[(uint)iObj];
      uVar11 = (ulong)(int)uVar16;
      if (-1 < (long)uVar11) {
        pfVar3 = *pVVar4->pCostsFlt;
        if (pfVar3 == (float *)0x0) {
          fVar17 = (float)iObj;
        }
        else {
          fVar17 = pfVar3[(uint)iObj];
        }
        piVar7 = pVVar4->pHeap;
        if (piVar7[uVar11] == iObj) {
          if (uVar16 < 2) {
            piVar7[uVar11] = iObj;
            piVar5[(uint)iObj] = uVar16;
          }
          else {
            bVar14 = true;
            uVar13 = (ulong)uVar16;
            while( true ) {
              uVar13 = uVar13 >> 1;
              iVar8 = piVar7[uVar13];
              if (pfVar3 == (float *)0x0) {
                fVar18 = (float)iVar8;
              }
              else {
                fVar18 = pfVar3[iVar8];
              }
              uVar9 = (uint)uVar11;
              if (fVar17 <= fVar18) break;
              piVar7[uVar11 & 0xffffffff] = iVar8;
              piVar5[iVar8] = uVar9;
              bVar14 = false;
              uVar11 = uVar13;
              if (uVar9 < 4) {
                piVar7[uVar13] = iObj;
                piVar5[(uint)iObj] = (int)uVar13;
                return;
              }
            }
            piVar7[uVar11 & 0xffffffff] = iObj;
            piVar5[(uint)iObj] = uVar9;
            if (!bVar14) {
              return;
            }
          }
          if (pfVar3 == (float *)0x0) {
            fVar17 = (float)iObj;
          }
          else {
            fVar17 = pfVar3[(uint)iObj];
          }
          uVar9 = (int)uVar11 * 2;
          iVar8 = pVVar4->nSize;
          iVar10 = (int)uVar11;
          if ((int)uVar9 < iVar8) {
            do {
              iVar10 = (int)uVar11;
              uVar16 = uVar9 | 1;
              if ((int)uVar16 < iVar8) {
                if (pfVar3 == (float *)0x0) {
                  fVar18 = (float)piVar7[(int)uVar9];
                  fVar19 = (float)piVar7[(int)uVar16];
                }
                else {
                  fVar18 = pfVar3[piVar7[(int)uVar9]];
                  fVar19 = pfVar3[piVar7[(int)uVar16]];
                }
                uVar11 = (ulong)uVar9;
                if (fVar18 < fVar19) {
                  uVar11 = (ulong)uVar16;
                }
              }
              else {
                uVar11 = (ulong)uVar9;
              }
              iVar15 = (int)uVar11;
              if (iVar8 <= iVar15) {
                __assert_fail("child < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                              ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
              }
              iVar8 = piVar7[iVar15];
              if (pfVar3 == (float *)0x0) {
                fVar18 = (float)iVar8;
              }
              else {
                fVar18 = pfVar3[iVar8];
              }
              if (fVar18 <= fVar17) break;
              piVar7[iVar10] = iVar8;
              piVar5[iVar8] = iVar10;
              uVar9 = iVar15 * 2;
              iVar8 = pVVar4->nSize;
              iVar10 = iVar15;
            } while ((int)uVar9 < iVar8);
          }
          piVar7[iVar10] = iObj;
          piVar5[(uint)iObj] = iVar10;
          return;
        }
        goto LAB_003ac910;
      }
    }
    if (iVar8 != 0) {
      if ((int)uVar9 <= pVVar4->nSize) {
        uVar2 = pVVar4->nSize + 1;
        uVar16 = uVar9 * 2;
        iVar8 = uVar9 * -2;
        uVar9 = uVar16;
        if (uVar2 != uVar16 && SBORROW4(uVar2,uVar16) == (int)(uVar2 + iVar8) < 0) {
          uVar9 = uVar2;
        }
        lVar6 = (long)(int)uVar9;
        sVar1 = lVar6 * 4;
        if (pVVar4->pHeap == (int *)0x0) {
          piVar5 = (int *)malloc(sVar1);
        }
        else {
          piVar5 = (int *)realloc(pVVar4->pHeap,sVar1);
        }
        pVVar4->pHeap = piVar5;
        if (pVVar4->pOrder == (int *)0x0) {
          piVar7 = (int *)malloc(sVar1);
        }
        else {
          piVar7 = (int *)realloc(pVVar4->pOrder,sVar1);
          piVar5 = pVVar4->pHeap;
        }
        pVVar4->pOrder = piVar7;
        memset(piVar5 + pVVar4->nCap,0xff,(lVar6 - pVVar4->nCap) * 4);
        memset(pVVar4->pOrder + pVVar4->nCap,0xff,(lVar6 - pVVar4->nCap) * 4);
        pVVar4->nCap = uVar9;
      }
      if ((int)uVar9 <= iObj) {
        uVar2 = iObj + 1;
        uVar16 = uVar9 * 2;
        iVar8 = uVar9 * -2;
        uVar9 = uVar16;
        if (uVar2 != uVar16 && SBORROW4(uVar2,uVar16) == (int)(uVar2 + iVar8) < 0) {
          uVar9 = uVar2;
        }
        sVar1 = (ulong)uVar9 * 4;
        if (pVVar4->pHeap == (int *)0x0) {
          piVar5 = (int *)malloc(sVar1);
        }
        else {
          piVar5 = (int *)realloc(pVVar4->pHeap,sVar1);
        }
        pVVar4->pHeap = piVar5;
        if (pVVar4->pOrder == (int *)0x0) {
          piVar7 = (int *)malloc(sVar1);
        }
        else {
          piVar7 = (int *)realloc(pVVar4->pOrder,sVar1);
          piVar5 = pVVar4->pHeap;
        }
        pVVar4->pOrder = piVar7;
        memset(piVar5 + pVVar4->nCap,0xff,((long)(int)uVar9 - (long)pVVar4->nCap) * 4);
        memset(pVVar4->pOrder + pVVar4->nCap,0xff,((long)(int)uVar9 - (long)pVVar4->nCap) * 4);
        pVVar4->nCap = uVar9;
      }
      iVar8 = pVVar4->nSize;
      if ((int)uVar9 <= iVar8) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar5 = pVVar4->pOrder;
      if (piVar5[(uint)iObj] != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar7 = pVVar4->pHeap;
      if (piVar7[iVar8] != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar5[(uint)iObj] = iVar8;
      iVar8 = pVVar4->nSize;
      pVVar4->nSize = iVar8 + 1;
      piVar7[iVar8] = iObj;
      pfVar3 = *pVVar4->pCostsFlt;
      if (pfVar3 == (float *)0x0) {
        fVar17 = (float)iObj;
      }
      else {
        fVar17 = pfVar3[(uint)iObj];
      }
      uVar9 = piVar5[(uint)iObj];
      uVar11 = (ulong)(int)uVar9;
      if (uVar11 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (piVar7[uVar11] != iObj) {
LAB_003ac910:
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (1 < (int)uVar9) {
        uVar13 = (ulong)uVar9;
        uVar12 = uVar11;
        do {
          uVar16 = (uint)uVar12;
          uVar13 = uVar13 >> 1;
          iVar8 = piVar7[uVar13];
          if (pfVar3 == (float *)0x0) {
            fVar18 = (float)iVar8;
          }
          else {
            fVar18 = pfVar3[iVar8];
          }
          uVar11 = uVar12 & 0xffffffff;
          uVar9 = uVar16;
          if (fVar17 <= fVar18) break;
          piVar7[uVar12 & 0xffffffff] = iVar8;
          piVar5[iVar8] = uVar16;
          uVar9 = (uint)uVar13;
          uVar12 = uVar13;
          uVar11 = uVar13;
        } while (3 < uVar16);
      }
      piVar7[uVar11] = iObj;
      piVar5[(uint)iObj] = uVar9;
    }
  }
  return;
}

Assistant:

void Acb_ObjUpdatePriority( Acb_Ntk_t * p, int iObj )
{
    int nPaths;
    if ( Acb_ObjIsCio(p, iObj) || Acb_ObjLevelD(p, iObj) == 1 )
        return;
    if ( p->vQue == NULL )
    {
        Acb_NtkCleanObjCounts( p );
        p->vQue = Vec_QueAlloc( 1000 );
        Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    }
    nPaths = Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj);
    Acb_ObjSetCounts( p, iObj, (float)nPaths );
    if ( Vec_QueIsMember( p->vQue, iObj ) )
    {
//printf( "Updating object %d with count %d\n", iObj, nPaths );
        Vec_QueUpdate( p->vQue, iObj );
    }
    else if ( nPaths )
    {
//printf( "Adding object %d with count %d\n", iObj, nPaths );
        Vec_QuePush( p->vQue, iObj );
    }
}